

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon_merge_example.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  initializer_list<glm::vec<2,_float,_(glm::qualifier)0>_> __l;
  initializer_list<glm::vec<2,_float,_(glm::qualifier)0>_> __l_00;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  edge_list2;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  edge_list;
  PolygonMerge merge;
  allocator_type local_b9;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  local_b8;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  local_a0;
  PolygonMerge local_88;
  
  local_88.heap_.objs_.
  super__Vector_base<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>,_std::allocator<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x42c8000042c80000;
  local_88.out_lines_.super__Vector_base<TRM::VertexList,_std::allocator<TRM::VertexList>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x42c8000041200000;
  local_88.heap_.objs_.
  super__Vector_base<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>,_std::allocator<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4120000041200000;
  local_88.heap_.objs_.
  super__Vector_base<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>,_std::allocator<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4120000042c80000;
  local_88.out_lines_.super__Vector_base<TRM::VertexList,_std::allocator<TRM::VertexList>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x4120000041200000;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_88;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector(&local_a0,__l,(allocator_type *)&local_b8);
  local_88.heap_.objs_.
  super__Vector_base<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>,_std::allocator<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x42a0000042a00000;
  local_88.out_lines_.super__Vector_base<TRM::VertexList,_std::allocator<TRM::VertexList>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x42a0000041a00000;
  local_88.heap_.objs_.
  super__Vector_base<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>,_std::allocator<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x42a0000041a00000;
  local_88.heap_.objs_.
  super__Vector_base<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>,_std::allocator<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x41a0000041a00000;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_88;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector(&local_b8,__l_00,&local_b9);
  TRM::PolygonMerge::PolygonMerge(&local_88);
  TRM::PolygonMerge::do_merge(&local_88,&local_a0,&local_b8);
  TRM::PolygonMerge::~PolygonMerge(&local_88);
  if (local_b8.
      super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0.
      super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.
                    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.
                          super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.
                          super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, const char** argv) {
  std::vector<glm::vec2> edge_list{
      {10, 10},
      {100, 10},
      {100, 100},
      {10, 100},
      {10, 10},
  };

  std::vector<glm::vec2> edge_list2{
      {20, 80},
      {20, 20},
      {80, 80},
      {20, 80},
  };


  TRM::PolygonMerge merge{};

  merge.do_merge(edge_list, edge_list2);


  return 0;
}